

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

RandSeqProductionSymbol *
slang::ast::RandSeqProductionSymbol::fromSyntax(Scope *scope,ProductionSyntax *syntax)

{
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *pSVar1;
  undefined1 *puVar2;
  size_t sVar3;
  SyntaxNode *syntax_00;
  int iVar4;
  RandSeqProductionSymbol *pRVar5;
  undefined4 extraout_var;
  RsRuleSyntax *syntax_01;
  StatementBlockSymbol *symbol;
  char *pcVar6;
  ParentList *pPVar7;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  Compilation *args_00;
  Scope *this;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> args;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_78 [2];
  SourceLocation local_38;
  
  args_00 = scope->compilation;
  local_78[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_38 = parsing::Token::location(&syntax->name);
  pRVar5 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args_00->super_BumpAllocator,args_00,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_78,&local_38);
  (pRVar5->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  if (syntax->dataType == (DataTypeSyntax *)0x0) {
    (pRVar5->declaredReturnType).type = args_00->voidType;
  }
  else {
    (pRVar5->declaredReturnType).typeOrLink.typeSyntax = syntax->dataType;
    puVar2 = &(pRVar5->declaredReturnType).field_0x3f;
    *puVar2 = *puVar2 & 0x7f;
  }
  if (syntax->portList != (FunctionPortListSyntax *)0x0) {
    local_78[0].len = 0;
    local_78[0].data_ = (pointer)((long)local_78 + 0x18);
    local_78[0].cap = 5;
    SubroutineSymbol::buildArguments(&pRVar5->super_Scope,scope,syntax->portList,Automatic,local_78)
    ;
    iVar4 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_78,(EVP_PKEY_CTX *)args_00,src);
    (pRVar5->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    (pRVar5->arguments)._M_extent._M_extent_value = extraout_RDX;
    SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup
              (local_78,(EVP_PKEY_CTX *)args_00);
  }
  pSVar1 = &syntax->rules;
  local_78[0].len = 0;
  local_78[0].data_ = (pointer)pSVar1;
  sVar3 = (syntax->rules).elements._M_extent._M_extent_value;
  this = &pRVar5->super_Scope;
  pcVar6 = (char *)0x0;
  pPVar7 = pSVar1;
  while ((pPVar7 != pSVar1 || (pcVar6 != (char *)(sVar3 + 1 >> 1)))) {
    syntax_01 = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::
                iterator_base<const_slang::syntax::RsRuleSyntax_*>::dereference
                          ((iterator_base<const_slang::syntax::RsRuleSyntax_*> *)local_78);
    syntax_00 = (syntax_01->super_SyntaxNode).previewNode;
    if (syntax_00 != (SyntaxNode *)0x0) {
      Scope::addMembers(this,syntax_00);
    }
    symbol = StatementBlockSymbol::fromSyntax(this,syntax_01);
    Scope::addMember(this,&symbol->super_Symbol);
    pcVar6 = (char *)(local_78[0].len + 1);
    local_78[0].len = (size_type)pcVar6;
    pPVar7 = (ParentList *)local_78[0].data_;
  }
  return pRVar5;
}

Assistant:

RandSeqProductionSymbol& RandSeqProductionSymbol::fromSyntax(const Scope& scope,
                                                             const ProductionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<RandSeqProductionSymbol>(comp, syntax.name.valueText(),
                                                        syntax.name.location());
    result->setSyntax(syntax);

    if (syntax.dataType)
        result->declaredReturnType.setTypeSyntax(*syntax.dataType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    if (syntax.portList) {
        SmallVector<const FormalArgumentSymbol*> args;
        SubroutineSymbol::buildArguments(*result, scope, *syntax.portList,
                                         VariableLifetime::Automatic, args);
        result->arguments = args.copy(comp);
    }

    for (auto rule : syntax.rules) {
        if (rule->previewNode)
            result->addMembers(*rule->previewNode);

        auto& ruleBlock = StatementBlockSymbol::fromSyntax(*result, *rule);
        result->addMember(ruleBlock);
    }

    return *result;
}